

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O2

size_t __thiscall
Assimp::IFC::anon_unknown_9::Line::EstimateSampleCount(Line *this,IfcFloat a,IfcFloat b)

{
  bool bVar1;
  
  bVar1 = Curve::InRange(&this->super_Curve,a);
  if (!bVar1) {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0xab,
                  "virtual size_t Assimp::IFC::(anonymous namespace)::Line::EstimateSampleCount(IfcFloat, IfcFloat) const"
                 );
  }
  bVar1 = Curve::InRange(&this->super_Curve,b);
  if (bVar1) {
    return 2 - (ulong)(a == b);
  }
  __assert_fail("InRange( b )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                ,0xac,
                "virtual size_t Assimp::IFC::(anonymous namespace)::Line::EstimateSampleCount(IfcFloat, IfcFloat) const"
               );
}

Assistant:

size_t EstimateSampleCount(IfcFloat a, IfcFloat b) const {
        ai_assert( InRange( a ) );
        ai_assert( InRange( b ) );
        // two points are always sufficient for a line segment
        return a==b ? 1 : 2;
    }